

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  int a [4];
  undefined1 local_38 [16];
  
  puVar1 = local_38;
  lVar2 = 1;
  do {
    printf("%lu-th number: ",lVar2);
    __isoc99_scanf("%d",puVar1);
    puVar1 = puVar1 + 4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  auVar8._0_4_ = -(uint)(0 < local_38._0_4_);
  auVar8._4_4_ = -(uint)(0 < local_38._4_4_);
  auVar8._8_4_ = -(uint)(0 < local_38._8_4_);
  auVar8._12_4_ = -(uint)(0 < local_38._12_4_);
  auVar8 = auVar8 & local_38;
  auVar5._0_8_ = auVar8._8_8_;
  auVar5._8_4_ = auVar8._8_4_;
  auVar5._12_4_ = auVar8._12_4_;
  auVar4._0_4_ = -(uint)(auVar8._8_4_ < auVar8._0_4_);
  auVar4._4_4_ = -(uint)(auVar8._12_4_ < auVar8._4_4_);
  auVar4._8_8_ = 0;
  auVar5 = ~auVar4 & auVar5 | auVar8 & auVar4;
  uVar3 = auVar5._0_4_;
  uVar6 = auVar5._4_4_;
  uVar7 = -(uint)((int)uVar6 < (int)uVar3);
  printf("The biggest number is %d.\n",(ulong)(~uVar7 & uVar6 | uVar3 & uVar7));
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int a[N_INT];

  for (size_t i = 0; i < N_INT; i++) {
    printf("%lu-th number: ", i + 1);
    scanf("%d", &a[i]);
  }

  int max = 0;
  for (size_t i = 0; i < N_INT; i++) {
    if (a[i] > max) max = a[i];
  }

  printf("The biggest number is %d.\n", max);

  return 0;
}